

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7_arr_func_3.cpp
# Opt level: O2

int fill_array(double *ar,int limit)

{
  double temp;
  
  if (limit < 1) {
    limit = 0;
  }
  if (limit != 0) {
    std::operator<<((ostream *)&std::cout,"Enter value # ");
  }
  return 0;
}

Assistant:

int fill_array (double ar[], int limit)
{
    using namespace std;
    double temp;
    int i;
    for (i = 0; i < limit; i++)
    {
        cout << "Enter value # " << (i + 1) << ":";
        cin >> temp;
        if (!cin) {
            cin.clear();
            //  if \n, just skip
            while(cin.get() != '\n')
            {
                continue;
            }
            cout << "Bad input; input process terminated.\n";
            break;
        }
        else if (temp < 0)
        {
            // if value is less than 0
            break;
        }
        //  write into array
        ar[i] = temp;
    }

    //  return the actual input numbers
    return i;
}